

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * dxil_spv::CFGStructurizer::rewind_candidate_split_node(CFGNode *node)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  CFGNode *in_RDI;
  CFGNode *candidate;
  
  do {
    do {
      candidate = in_RDI;
      if (((((candidate->headers).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (candidate->headers).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((long)(candidate->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(candidate->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8)) ||
          (in_RDI = candidate->split_merge_block_candidate, in_RDI == (CFGNode *)0x0)) ||
         (in_RDI->forward_post_visit_order != candidate->forward_post_visit_order)) {
        return candidate;
      }
      ppCVar2 = (in_RDI->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (((long)(in_RDI->succ).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 == 8) &&
            (*ppCVar2 == candidate));
    ppCVar2 = (in_RDI->headers).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (ppCVar2 !=
           (in_RDI->headers).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar1 = *ppCVar2;
      if (pCVar1->loop_ladder_block == candidate) {
        return candidate;
      }
      ppCVar2 = ppCVar2 + 1;
      if (pCVar1->loop_merge_block == candidate) {
        return candidate;
      }
    }
  } while( true );
}

Assistant:

CFGNode *CFGStructurizer::rewind_candidate_split_node(CFGNode *node)
{
	// If we created a new helper pred block during traversal, it might not
	// exist in forward_post_visit_order.
	// Look for the replacement block here to make sure it gets processed in the appropriate order.
	// The replacement can happen in-line in this function,
	// so there is no chance to re-traverse the CFG.
	// Only consider blocks that we trivially post-dominate and that
	// definitely have no entry in forward_post_visit_order already.
	while (node->headers.empty() &&
	       node->pred.size() == 1 &&
	       node->split_merge_block_candidate &&
	       node->split_merge_block_candidate->forward_post_visit_order == node->forward_post_visit_order)
	{
		auto *candidate = node->split_merge_block_candidate;
		if (candidate->succ.size() != 1 || candidate->succ.front() != node)
		{
			// This is a ladder block of some sort. It's possible we're already in a "resolved" state,
			// so we really should not try to split further.
			// If we're considered a proper ladder block by any of our headers, bail.
			for (auto *header : candidate->headers)
				if (header->loop_ladder_block == node || header->loop_merge_block == node)
					return node;
		}

		node = candidate;
	}

	return node;
}